

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_OnlyReportsUnusedImportsForFilesBeingGenerated_Test::
~CommandLineInterfaceTest_OnlyReportsUnusedImportsForFilesBeingGenerated_Test
          (CommandLineInterfaceTest_OnlyReportsUnusedImportsForFilesBeingGenerated_Test *this)

{
  CommandLineInterfaceTest_OnlyReportsUnusedImportsForFilesBeingGenerated_Test *this_local;
  
  ~CommandLineInterfaceTest_OnlyReportsUnusedImportsForFilesBeingGenerated_Test(this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest,
       OnlyReportsUnusedImportsForFilesBeingGenerated) {
  CreateTempFile("unused.proto",
                 "syntax = \"proto2\";\n"
                 "message Unused {}\n");
  CreateTempFile("bar.proto",
                 "syntax = \"proto2\";\n"
                 "import \"unused.proto\";\n"
                 "message Bar {}\n");
  CreateTempFile("foo.proto",
                 "syntax = \"proto2\";\n"
                 "import \"bar.proto\";\n"
                 "message Foo {\n"
                 "  optional Bar bar = 1;\n"
                 "}\n");

  Run("protocol_compiler --test_out=$tmpdir "
      "--proto_path=$tmpdir foo.proto");
  ExpectNoErrors();
}